

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

void xor_buffered_decrement_counter
               (uint32_t index,uint64_t hash,xor_setbuffer_t *buffer,xor_xorset_t *sets,
               xor_keyindex_t *Q,size_t *Qsize)

{
  byte bVar1;
  xor_keyindex_t *pxVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  uint32_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  
  bVar1 = (byte)buffer->insignificantbits;
  uVar10 = index >> (bVar1 & 0x1f);
  pxVar2 = buffer->buffer;
  puVar11 = buffer->counts;
  uVar5 = (uVar10 << (bVar1 & 0x1f)) + puVar11[uVar10];
  pxVar2[uVar5].index = index;
  pxVar2[uVar5].hash = hash;
  uVar7 = puVar11[uVar10] + 1;
  puVar11[uVar10] = uVar7;
  if (uVar7 == buffer->slotsize) {
    sVar8 = *Qsize;
    uVar9 = (ulong)(uVar10 << ((byte)buffer->insignificantbits & 0x1f));
    uVar4 = uVar9 << 4 | 8;
    for (uVar6 = uVar9; uVar6 < uVar7 + uVar9; uVar6 = uVar6 + 1) {
      uVar3 = *(ulong *)((long)&buffer->buffer->hash + uVar4);
      uVar12 = uVar3 & 0xffffffff;
      uVar13 = sets[uVar12].xormask ^ *(ulong *)((long)buffer->buffer + (uVar4 - 8));
      sets[uVar12].xormask = uVar13;
      uVar7 = sets[uVar12].count - 1;
      sets[uVar12].count = uVar7;
      if (uVar7 == 1) {
        Q[sVar8].hash = uVar13;
        *(ulong *)&Q[sVar8].index = uVar3;
        sVar8 = sVar8 + 1;
        puVar11 = buffer->counts;
      }
      uVar7 = puVar11[uVar10];
      uVar4 = uVar4 + 0x10;
    }
    *Qsize = sVar8;
    puVar11[uVar10] = 0;
  }
  return;
}

Assistant:

static inline void xor_buffered_decrement_counter(uint32_t index, uint64_t hash,
                                                  xor_setbuffer_t *buffer,
                                                  xor_xorset_t *sets,
                                                  xor_keyindex_t *Q,
                                                  size_t *Qsize) {
  uint32_t slot = index >> (uint32_t)buffer->insignificantbits;
  size_t addr = buffer->counts[slot] + (slot << (uint32_t)buffer->insignificantbits);
  buffer->buffer[addr].index = index;
  buffer->buffer[addr].hash = hash;
  buffer->counts[slot]++;
  if (buffer->counts[slot] == buffer->slotsize) {
    size_t qsize = *Qsize;
    size_t offset = (slot << (uint32_t)buffer->insignificantbits);
    for (size_t i = offset; i < buffer->counts[slot] + offset; i++) {
      xor_keyindex_t ki =
          buffer->buffer[i];
      sets[ki.index].xormask ^= ki.hash;
      sets[ki.index].count--;
      if (sets[ki.index].count == 1) {
        ki.hash = sets[ki.index].xormask;
        Q[qsize] = ki;
        qsize += 1;
      }
    }
    *Qsize = qsize;
    buffer->counts[slot] = 0;
  }
}